

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioJson.c
# Opt level: O2

char * Json_ReadPreprocess(char *pIn,int nFileSize)

{
  byte bVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  
  pcVar2 = (char *)malloc((long)(nFileSize * 3));
  uVar3 = 0;
  uVar4 = (ulong)(uint)nFileSize;
  if (nFileSize < 1) {
    uVar4 = uVar3;
  }
  iVar5 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    bVar1 = pIn[uVar3];
    if ((bVar1 - 0x5b < 0x23) && ((0x500000005U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)) {
      pcVar2[iVar5] = ' ';
      pcVar2[(long)iVar5 + 1] = bVar1;
      pcVar2[(long)iVar5 + 2] = ' ';
      iVar5 = iVar5 + 3;
    }
    else {
      pcVar2[iVar5] = bVar1;
      iVar5 = iVar5 + 1;
    }
  }
  pcVar2[iVar5] = '\0';
  return pcVar2;
}

Assistant:

char * Json_ReadPreprocess( char * pIn, int nFileSize )
{
    char * pOut = ABC_ALLOC( char, 3*nFileSize ); int i, k = 0;
    for ( i = 0; i < nFileSize; i++ )
        if ( pIn[i] == '{' || pIn[i] == '}' || pIn[i] == '[' || pIn[i] == ']' )
        {
            pOut[k++] = ' ';
            pOut[k++] = pIn[i];
            pOut[k++] = ' ';
        }
        else
            pOut[k++] = pIn[i];
    pOut[k++] = '\0';
    return pOut;
}